

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cc
# Opt level: O0

void __thiscall wabt::Features::UpdateDependencies(Features *this)

{
  Features *this_local;
  
  if ((this->exceptions_enabled_ & 1U) != 0) {
    this->reference_types_enabled_ = true;
  }
  if ((this->reference_types_enabled_ & 1U) != 0) {
    this->bulk_memory_enabled_ = true;
  }
  return;
}

Assistant:

void Features::UpdateDependencies() {
  // Exception handling requires reference types.
  if (exceptions_enabled_) {
    reference_types_enabled_ = true;
  }
  // Reference types requires bulk memory.
  if (reference_types_enabled_) {
    bulk_memory_enabled_ = true;
  }
}